

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O1

void io_buf::close_file_or_socket(int f)

{
  close(f);
  return;
}

Assistant:

void io_buf::close_file_or_socket(int f)
{
#ifdef _WIN32
  if (io_buf::is_socket(f))
    closesocket(f);
  else
    _close(f);
#else
  close(f);
#endif
}